

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

SUNErrCode SUNContext_SetLogger(SUNContext sunctx,SUNLogger logger)

{
  SUNErrCode SVar1;
  
  if (sunctx == (SUNContext)0x0) {
    return -0x26fa;
  }
  if ((sunctx->logger != (SUNLogger)0x0) && (sunctx->own_logger != 0)) {
    SVar1 = SUNLogger_Destroy(&sunctx->logger);
    if (SVar1 != 0) {
      return -0x2702;
    }
    sunctx->logger = (SUNLogger)0x0;
  }
  sunctx->logger = logger;
  sunctx->own_logger = 0;
  return 0;
}

Assistant:

SUNErrCode SUNContext_SetLogger(SUNContext sunctx, SUNLogger logger)
{
  if (!sunctx) { return SUN_ERR_SUNCTX_CORRUPT; }

  SUNFunctionBegin(sunctx);

  /* free any existing logger */
  if (sunctx->logger && sunctx->own_logger)
  {
    if (SUNLogger_Destroy(&(sunctx->logger))) { return SUN_ERR_DESTROY_FAIL; }
    sunctx->logger = NULL;
  }

  /* set logger */
  sunctx->logger     = logger;
  sunctx->own_logger = SUNFALSE;

  return SUN_SUCCESS;
}